

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O0

void generateVelocypack<JSONFormat>(BuilderContext *ctx)

{
  bool bVar1;
  result_type_conflict rVar2;
  size_type sVar3;
  double __x;
  uint __fd;
  ulong uVar4;
  Builder *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar5;
  uint64_t utcDateValue;
  uint64_t uintValue_1;
  double doubleValue;
  int64_t intValue;
  uint64_t uintValue;
  uint64_t value;
  uint32_t i_1;
  uint32_t numMembers_1;
  uint32_t i;
  uint32_t numMembers;
  RandomBuilderAdditions randomBuilderAdds;
  RandomGenerator *randomGenerator;
  Builder *builder;
  RandomBuilderAdditions maxValue;
  undefined6 in_stack_fffffffffffffe18;
  ValueType in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffffe20;
  undefined6 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2e;
  ValueType in_stack_fffffffffffffe2f;
  Value *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe40;
  uint local_34;
  uint local_2c;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar6;
  
  uVar6 = 7;
  do {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_fffffffffffffe20);
    if (*(uint *)&in_RDI[0xe]._keyWritten < 0xb) break;
  } while ((uint)(rVar2 % 7) < 2);
  switch(rVar2 % 7) {
  case 0:
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_fffffffffffffe20);
    uVar4 = (ulong)((byte)-((byte)rVar2 & 1) & 1);
    arangodb::velocypack::Builder::openArray
              ((Builder *)in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f);
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_fffffffffffffe20);
    for (local_2c = 0; local_2c < (uint)(rVar2 % 10); local_2c = local_2c + 1) {
      *(int *)&in_RDI[0xe]._keyWritten = *(int *)&in_RDI[0xe]._keyWritten + 1;
      generateVelocypack<JSONFormat>((BuilderContext *)CONCAT44(uVar6,in_stack_fffffffffffffff0));
      *(int *)&in_RDI[0xe]._keyWritten = *(int *)&in_RDI[0xe]._keyWritten + -1;
    }
    arangodb::velocypack::Builder::close(in_RDI,(int)uVar4);
    break;
  case 1:
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::operator()(in_stack_fffffffffffffe20);
    arangodb::velocypack::Builder::openObject
              ((Builder *)in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f);
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_fffffffffffffe20);
    sVar3 = std::
            vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&in_RDI[0xe]._indexes);
    if (*(uint *)&in_RDI[0xe]._keyWritten < sVar3) {
      std::
      vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&in_RDI[0xe]._indexes,(ulong)*(uint *)&in_RDI[0xe]._keyWritten);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x106753);
    }
    else {
      std::
      vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::resize(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    *(int *)&in_RDI[0xe]._keyWritten = *(int *)&in_RDI[0xe]._keyWritten + 1;
    for (local_34 = 0; local_34 < (uint)(rVar2 % 10); local_34 = local_34 + 1) {
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10679f);
        generateUtf8String((RandomGenerator *)in_stack_fffffffffffffe20,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
        std::
        vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&in_RDI[0xe]._indexes,(ulong)(*(int *)&in_RDI[0xe]._keyWritten - 1));
        pVar5 = std::
                unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::emplace<std::__cxx11::string&>
                          ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffe30,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe2f,
                                    CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
      } while (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      arangodb::velocypack::Value::Value
                ((Value *)in_stack_fffffffffffffe20,
                 (string *)
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),None);
      arangodb::velocypack::Builder::add
                ((Builder *)in_stack_fffffffffffffe20,
                 (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
      generateVelocypack<JSONFormat>((BuilderContext *)CONCAT44(uVar6,in_stack_fffffffffffffff0));
    }
    *(int *)&in_RDI[0xe]._keyWritten = *(int *)&in_RDI[0xe]._keyWritten + -1;
    __fd = *(uint *)&in_RDI[0xe]._keyWritten;
    std::
    vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&in_RDI[0xe]._indexes,(ulong)__fd);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1068d7);
    arangodb::velocypack::Builder::close(in_RDI,__fd);
    break;
  case 2:
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::operator()(in_stack_fffffffffffffe20);
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f,
               in_stack_fffffffffffffe1e);
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    break;
  case 3:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10694a);
    generateUtf8String((RandomGenerator *)in_stack_fffffffffffffe20,
                       (string *)
                       CONCAT17(in_stack_fffffffffffffe1f,
                                CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffe20,
               (string *)
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),None);
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    break;
  case 4:
    arangodb::velocypack::Value::Value
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f,(bool)in_stack_fffffffffffffe2e);
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    break;
  case 5:
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::operator()(in_stack_fffffffffffffe20);
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffe20,
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),None);
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    break;
  case 6:
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::operator()(in_stack_fffffffffffffe20);
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffe20,
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),None);
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    break;
  case 7:
    do {
      __x = (double)std::
                    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                    ::operator()(in_stack_fffffffffffffe20);
      bVar1 = std::isfinite(__x);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffe20,
               (double)CONCAT17(in_stack_fffffffffffffe1f,
                                CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),None)
    ;
    arangodb::velocypack::Builder::add
              ((Builder *)in_stack_fffffffffffffe20,
               (Value *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
  }
  return;
}

Assistant:

static void generateVelocypack(BuilderContext& ctx) {
  constexpr RandomBuilderAdditions maxValue = maxRandomType<Format>();

  using limits = KnownLimitValues;

  Builder& builder = ctx.builder;
  RandomGenerator& randomGenerator = ctx.randomGenerator;

  while (true) {
    RandomBuilderAdditions randomBuilderAdds =
        static_cast<RandomBuilderAdditions>(randomGenerator.mt64() % maxValue);
    if (ctx.recursionDepth > limits::maxDepth &&
        randomBuilderAdds <= ADD_OBJECT) {
      continue;
    }
    switch (randomBuilderAdds) {
      case ADD_ARRAY: {
        builder.openArray(randomGenerator.mt64() % 2 ? true : false);
        uint32_t numMembers = randomGenerator.mt64() % limits::arrayNumMembers;
        for (uint32_t i = 0; i < numMembers; ++i) {
          ++ctx.recursionDepth;
          generateVelocypack<Format>(ctx);
          --ctx.recursionDepth;
        }
        builder.close();
        break;
      }
      case ADD_OBJECT: {
        builder.openObject(randomGenerator.mt64() % 2 ? true : false);
        uint32_t numMembers = randomGenerator.mt64() % limits::objNumMembers;
        if (ctx.tempObjectKeys.size() <= ctx.recursionDepth) {
          ctx.tempObjectKeys.resize(ctx.recursionDepth + 1);
        } else {
          ctx.tempObjectKeys[ctx.recursionDepth].clear();
        }
        VELOCYPACK_ASSERT(ctx.tempObjectKeys.size() > ctx.recursionDepth);
        ++ctx.recursionDepth;
        for (uint32_t i = 0; i < numMembers; ++i) {
          while (true) {
            ctx.tempString.clear();
            generateUtf8String(randomGenerator, ctx.tempString);
            if (ctx.tempObjectKeys[ctx.recursionDepth - 1]
                    .emplace(ctx.tempString)
                    .second) {
              break;
            }
          }
          // key
          builder.add(Value(ctx.tempString));
          // value
          generateVelocypack<Format>(ctx);
        }
        --ctx.recursionDepth;
        ctx.tempObjectKeys[ctx.recursionDepth].clear();
        builder.close();
        break;
      }
      case ADD_BOOLEAN:
        builder.add(Value(randomGenerator.mt64() % 2 ? true : false));
        break;
      case ADD_STRING: {
        ctx.tempString.clear();
        generateUtf8String(randomGenerator, ctx.tempString);
        builder.add(Value(ctx.tempString));
        break;
      }
      case ADD_NULL:
        builder.add(Value(ValueType::Null));
        break;
      case ADD_UINT64: {
        uint64_t value = randomGenerator.mt64();
        builder.add(Value(value));
        break;
      }
      case ADD_INT64: {
        uint64_t uintValue = randomGenerator.mt64();
        int64_t intValue;
        memcpy(&intValue, &uintValue, sizeof(uintValue));
        builder.add(Value(intValue));
        break;
      }
      case ADD_DOUBLE: {
        double doubleValue;
        do {
          uint64_t uintValue = randomGenerator.mt64();
          memcpy(&doubleValue, &uintValue, sizeof(uintValue));
        } while (!std::isfinite(doubleValue));
        builder.add(Value(doubleValue));
        break;
      }
      case ADD_UTC_DATE: {
        uint64_t utcDateValue = randomGenerator.mt64();
        builder.add(Value(utcDateValue, ValueType::UTCDate));
        break;
      }
      case ADD_BINARY: {
        ctx.tempString.clear();
        generateRandBinary(randomGenerator, ctx.tempString);
        builder.add(ValuePair(ctx.tempString.data(), ctx.tempString.size(),
                              ValueType::Binary));
        break;
      }
      case ADD_EXTERNAL: {
        builder.add(
            Value(static_cast<void const*>(&nullSlice), ValueType::External));
        break;
      }
      case ADD_ILLEGAL:
        builder.add(Value(ValueType::Illegal));
        break;
      case ADD_MIN_KEY:
        builder.add(Value(ValueType::MinKey));
        break;
      case ADD_MAX_KEY:
        builder.add(Value(ValueType::MaxKey));
        break;
      default:
        VELOCYPACK_ASSERT(false);
    }
    break;
  }
}